

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O1

_Bool wiz_create_item_action(menu_conflict *m,ui_event *e,wchar_t oid)

{
  uint16_t uVar1;
  long lVar2;
  menu_conflict *menu;
  wchar_t *pwVar3;
  ulong uVar4;
  char *fmt;
  int iVar5;
  long lVar6;
  _Bool _Var7;
  ui_event uVar8;
  wchar_t choice [70];
  char title [80];
  char buf [80];
  wchar_t local_1f8 [72];
  char local_d8 [80];
  char local_88 [88];
  
  _Var7 = true;
  if (e->type == EVT_SELECT) {
    if (oid == L'\xffffd8f1') {
      cmdq_push((uint)!choose_artifact * 2 + CMD_WIZ_CREATE_ALL_ARTIFACT);
      _Var7 = false;
    }
    else {
      if (choose_artifact) {
        uVar1 = z_info->a_max;
        pwVar3 = &a_info[1].tval;
        iVar5 = 0;
        uVar4 = 1;
        do {
          if ((ushort)(uVar1 + (uVar1 == 0)) == uVar4) break;
          if (*pwVar3 == oid) {
            lVar6 = (long)iVar5;
            iVar5 = iVar5 + 1;
            local_1f8[lVar6] = (wchar_t)uVar4;
          }
          uVar4 = uVar4 + 1;
          pwVar3 = pwVar3 + 0x50;
        } while (iVar5 < 0x3c);
      }
      else {
        iVar5 = 0;
        uVar4 = 1;
        lVar6 = 0x346;
        do {
          if (z_info->k_max <= uVar4) break;
          if ((*(wchar_t *)((long)k_info + lVar6 + -0x62) == oid) &&
             (_Var7 = flag_has_dbg(k_info->flags + lVar6 + -0x80,4,0x12,"kind->kind_flags",
                                   "KF_INSTA_ART"), !_Var7)) {
            lVar2 = (long)iVar5;
            iVar5 = iVar5 + 1;
            local_1f8[lVar2] = (wchar_t)uVar4;
          }
          uVar4 = uVar4 + 1;
          lVar6 = lVar6 + 0x2c0;
        } while (iVar5 < 0x3c);
      }
      local_1f8[iVar5] = L'\xffffd8f1';
      local_1f8[(long)iVar5 + 1] = oid;
      screen_save();
      clear_from(L'\0');
      menu = menu_new(MN_SKIN_COLUMNS,&wiz_create_item_submenu);
      menu->selections = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
      object_base_name(local_88,0x50,oid,true);
      fmt = "What kind of %s?";
      if (choose_artifact != false) {
        fmt = "Which artifact %s? ";
      }
      strnfmt(local_d8,0x50,fmt,local_88);
      menu->title = local_d8;
      menu_setpriv(menu,iVar5 + 1,local_1f8);
      menu_layout(menu,&wiz_create_item_area);
      uVar8 = menu_select(menu,0,false);
      screen_load();
      mem_free(menu);
      _Var7 = uVar8.type == EVT_ESCAPE;
    }
  }
  return _Var7;
}

Assistant:

static bool wiz_create_item_action(struct menu *m, const ui_event *e, int oid)
{
	ui_event ret;
	struct menu *menu;

	char buf[80];
	char title[80];

	int choice[70];
	int num;

	int i;

	if (e->type != EVT_SELECT) return true;

	if (oid == WIZ_CREATE_ALL_MENU_ITEM) {
		cmdq_push((choose_artifact) ? CMD_WIZ_CREATE_ALL_ARTIFACT :
			CMD_WIZ_CREATE_ALL_OBJ);
		return false;
	}

	/* Artifacts */
	if (choose_artifact) {
		/* ...We have to search the whole artifact list. */
		for (num = 0, i = 1; (num < 60) && (i < z_info->a_max); i++) {
			const struct artifact *art = &a_info[i];

			if (art->tval != oid) continue;

			choice[num++] = i;
		}
	} else {
		/* Regular objects */
		for (num = 0, i = 1; (num < 60) && (i < z_info->k_max); i++) {
			struct object_kind *kind = &k_info[i];

			if (kind->tval != oid ||
					kf_has(kind->kind_flags, KF_INSTA_ART))
				continue;

			choice[num++] = i;
		}
	}

	/*
	 * Add a flag for an "All <tval>" item to create all svals of that
	 * tval. The tval is stored (in a super hacky way) beyond the end of
	 * the valid menu items. The menu won't render it, but we can still
	 * get to it without doing a bunch of work.
	 */
	choice[num++] = WIZ_CREATE_ALL_MENU_ITEM;
	choice[num] = oid;

	screen_save();
	clear_from(0);

	menu = menu_new(MN_SKIN_COLUMNS, &wiz_create_item_submenu);
	menu->selections = all_letters;

	object_base_name(buf, sizeof(buf), oid, true);
	if (choose_artifact) {
		strnfmt(title, sizeof(title), "Which artifact %s? ", buf);
	} else {
		strnfmt(title, sizeof(title), "What kind of %s?", buf);
	}
	menu->title = title;

	menu_setpriv(menu, num, choice);
	menu_layout(menu, &wiz_create_item_area);
	ret = menu_select(menu, 0, false);

	screen_load();
	mem_free(menu);

	return (ret.type == EVT_ESCAPE);
}